

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

Type * __thiscall spvtools::opt::analysis::TypeManager::GetType(TypeManager *this,uint32_t id)

{
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false> _Var1;
  uint32_t local_c;
  
  local_c = id;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->id_to_type_)._M_h,&local_c);
  if ((_Var1._M_cur == (__node_type *)0x0) &&
     (_Var1._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->id_to_incomplete_type_)._M_h,&local_c),
     _Var1._M_cur == (__node_type *)0x0)) {
    return (Type *)0x0;
  }
  return *(Type **)((long)&((_Var1._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>
                           ._M_storage._M_storage + 8);
}

Assistant:

Type* TypeManager::GetType(uint32_t id) const {
  auto iter = id_to_type_.find(id);
  if (iter != id_to_type_.end()) return (*iter).second;
  iter = id_to_incomplete_type_.find(id);
  if (iter != id_to_incomplete_type_.end()) return (*iter).second;
  return nullptr;
}